

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

void upb_MtDecoder_ValidateEntryField(upb_MtDecoder *d,upb_MiniTableField *f,uint32_t expected_num)

{
  _Bool _Var1;
  uint32_t uVar2;
  upb_FieldType uVar3;
  char *pcVar4;
  uint local_30;
  uint32_t not_ok_types;
  uint32_t f_number;
  char *name;
  uint32_t expected_num_local;
  upb_MiniTableField *f_local;
  upb_MtDecoder *d_local;
  
  pcVar4 = "val";
  if (expected_num == 1) {
    pcVar4 = "key";
  }
  uVar2 = upb_MiniTableField_Number(f);
  if (uVar2 != expected_num) {
    upb_MdDecoder_ErrorJmp
              (&d->base,"map %s did not have expected number (%d vs %d)",pcVar4,(ulong)expected_num,
               (ulong)uVar2);
  }
  _Var1 = upb_MiniTableField_IsScalar(f);
  if (!_Var1) {
    upb_MdDecoder_ErrorJmp(&d->base,"map %s cannot be repeated or map, or be in oneof",pcVar4);
  }
  if (expected_num == 1) {
    local_30 = 0x5c06;
  }
  else {
    local_30 = 0x400;
  }
  uVar3 = upb_MiniTableField_Type(f);
  if ((1 << ((byte)uVar3 & 0x1f) & local_30) != 0) {
    upb_MdDecoder_ErrorJmp
              (&d->base,"map %s cannot have type %d",pcVar4,
               (ulong)f->descriptortype_dont_copy_me__upb_internal_use_only);
  }
  return;
}

Assistant:

static void upb_MtDecoder_ValidateEntryField(upb_MtDecoder* d,
                                             const upb_MiniTableField* f,
                                             uint32_t expected_num) {
  const char* name = expected_num == 1 ? "key" : "val";
  const uint32_t f_number = upb_MiniTableField_Number(f);
  if (f_number != expected_num) {
    upb_MdDecoder_ErrorJmp(&d->base,
                           "map %s did not have expected number (%d vs %d)",
                           name, expected_num, f_number);
  }

  if (!upb_MiniTableField_IsScalar(f)) {
    upb_MdDecoder_ErrorJmp(
        &d->base, "map %s cannot be repeated or map, or be in oneof", name);
  }

  uint32_t not_ok_types;
  if (expected_num == 1) {
    not_ok_types = (1 << kUpb_FieldType_Float) | (1 << kUpb_FieldType_Double) |
                   (1 << kUpb_FieldType_Message) | (1 << kUpb_FieldType_Group) |
                   (1 << kUpb_FieldType_Bytes) | (1 << kUpb_FieldType_Enum);
  } else {
    not_ok_types = 1 << kUpb_FieldType_Group;
  }

  if ((1 << upb_MiniTableField_Type(f)) & not_ok_types) {
    upb_MdDecoder_ErrorJmp(&d->base, "map %s cannot have type %d", name,
                           (int)f->UPB_PRIVATE(descriptortype));
  }
}